

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void * xmlCopyElement(void *payload,xmlChar *name)

{
  xmlChar *pxVar1;
  xmlElementContentPtr pxVar2;
  xmlElementPtr cur;
  xmlElementPtr elem;
  xmlChar *name_local;
  void *payload_local;
  
  payload_local = (*xmlMalloc)(0x70);
  if ((xmlElementPtr)payload_local == (xmlElementPtr)0x0) {
    return (void *)0x0;
  }
  memset(payload_local,0,0x70);
  ((xmlElementPtr)payload_local)->type = XML_ELEMENT_DECL;
  ((xmlElementPtr)payload_local)->etype = *(xmlElementTypeVal *)((long)payload + 0x48);
  if (*(long *)((long)payload + 0x10) == 0) {
LAB_00176049:
    if (*(long *)((long)payload + 0x60) != 0) {
      pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x60));
      ((xmlElementPtr)payload_local)->prefix = pxVar1;
      if (((xmlElementPtr)payload_local)->prefix == (xmlChar *)0x0) goto LAB_001760c3;
    }
    if (*(long *)((long)payload + 0x50) != 0) {
      pxVar2 = xmlCopyElementContent(*(xmlElementContentPtr *)((long)payload + 0x50));
      ((xmlElementPtr)payload_local)->content = pxVar2;
      if (((xmlElementPtr)payload_local)->content == (xmlElementContentPtr)0x0) goto LAB_001760c3;
    }
    ((xmlElementPtr)payload_local)->attributes = (xmlAttributePtr)0x0;
  }
  else {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
    ((xmlElementPtr)payload_local)->name = pxVar1;
    if (((xmlElementPtr)payload_local)->name != (xmlChar *)0x0) goto LAB_00176049;
LAB_001760c3:
    xmlFreeElement((xmlElementPtr)payload_local);
    payload_local = (void *)0x0;
  }
  return payload_local;
}

Assistant:

static void *
xmlCopyElement(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlElementPtr elem = (xmlElementPtr) payload;
    xmlElementPtr cur;

    cur = (xmlElementPtr) xmlMalloc(sizeof(xmlElement));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlElement));
    cur->type = XML_ELEMENT_DECL;
    cur->etype = elem->etype;
    if (elem->name != NULL) {
	cur->name = xmlStrdup(elem->name);
        if (cur->name == NULL)
            goto error;
    }
    if (elem->prefix != NULL) {
	cur->prefix = xmlStrdup(elem->prefix);
        if (cur->prefix == NULL)
            goto error;
    }
    if (elem->content != NULL) {
        cur->content = xmlCopyElementContent(elem->content);
        if (cur->content == NULL)
            goto error;
    }
    /* TODO : rebuild the attribute list on the copy */
    cur->attributes = NULL;
    return(cur);

error:
    xmlFreeElement(cur);
    return(NULL);
}